

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O0

void start_pass_huff_decoder(j_decompress_ptr cinfo)

{
  long lVar1;
  long lVar2;
  long *in_RDI;
  jpeg_component_info *compptr;
  d_derived_tbl **pdtbl;
  int actbl;
  int dctbl;
  int blkn;
  int ci;
  huff_entropy_ptr_conflict entropy;
  d_derived_tbl **in_stack_00000510;
  int in_stack_00000518;
  boolean in_stack_0000051c;
  j_decompress_ptr in_stack_00000520;
  int local_18;
  int local_14;
  
  lVar1 = in_RDI[0x4a];
  if ((((*(int *)((long)in_RDI + 0x20c) != 0) || ((int)in_RDI[0x42] != 0x3f)) ||
      (*(int *)((long)in_RDI + 0x214) != 0)) || ((int)in_RDI[0x43] != 0)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x7a;
    (**(code **)(*in_RDI + 8))(in_RDI,0xffffffff);
  }
  for (local_14 = 0; local_14 < (int)in_RDI[0x36]; local_14 = local_14 + 1) {
    jpeg_make_d_derived_tbl(in_stack_00000520,in_stack_0000051c,in_stack_00000518,in_stack_00000510)
    ;
    jpeg_make_d_derived_tbl(in_stack_00000520,in_stack_0000051c,in_stack_00000518,in_stack_00000510)
    ;
    *(undefined4 *)(lVar1 + 0x28 + (long)local_14 * 4) = 0;
  }
  for (local_18 = 0; local_18 < (int)in_RDI[0x3c]; local_18 = local_18 + 1) {
    lVar2 = in_RDI[(long)*(int *)((long)in_RDI + (long)local_18 * 4 + 0x1e4) + 0x37];
    *(undefined8 *)(lVar1 + 0x80 + (long)local_18 * 8) =
         *(undefined8 *)(lVar1 + 0x40 + (long)*(int *)(lVar2 + 0x14) * 8);
    *(undefined8 *)(lVar1 + 0xd0 + (long)local_18 * 8) =
         *(undefined8 *)(lVar1 + 0x60 + (long)*(int *)(lVar2 + 0x18) * 8);
    if (*(int *)(lVar2 + 0x30) == 0) {
      *(undefined4 *)(lVar1 + 0x148 + (long)local_18 * 4) = 0;
      *(undefined4 *)(lVar1 + 0x120 + (long)local_18 * 4) = 0;
    }
    else {
      *(undefined4 *)(lVar1 + 0x120 + (long)local_18 * 4) = 1;
      *(uint *)(lVar1 + 0x148 + (long)local_18 * 4) = (uint)(1 < *(int *)(lVar2 + 0x24));
    }
  }
  *(undefined4 *)(lVar1 + 0x20) = 0;
  *(undefined8 *)(lVar1 + 0x18) = 0;
  *(undefined4 *)(lVar1 + 0x10) = 0;
  *(int *)(lVar1 + 0x38) = (int)in_RDI[0x2e];
  return;
}

Assistant:

METHODDEF(void)
start_pass_huff_decoder(j_decompress_ptr cinfo)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr)cinfo->entropy;
  int ci, blkn, dctbl, actbl;
  d_derived_tbl **pdtbl;
  jpeg_component_info *compptr;

  /* Check that the scan parameters Ss, Se, Ah/Al are OK for sequential JPEG.
   * This ought to be an error condition, but we make it a warning because
   * there are some baseline files out there with all zeroes in these bytes.
   */
  if (cinfo->Ss != 0 || cinfo->Se != DCTSIZE2 - 1 ||
      cinfo->Ah != 0 || cinfo->Al != 0)
    WARNMS(cinfo, JWRN_NOT_SEQUENTIAL);

  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    dctbl = compptr->dc_tbl_no;
    actbl = compptr->ac_tbl_no;
    /* Compute derived values for Huffman tables */
    /* We may do this more than once for a table, but it's not expensive */
    pdtbl = (d_derived_tbl **)(entropy->dc_derived_tbls) + dctbl;
    jpeg_make_d_derived_tbl(cinfo, TRUE, dctbl, pdtbl);
    pdtbl = (d_derived_tbl **)(entropy->ac_derived_tbls) + actbl;
    jpeg_make_d_derived_tbl(cinfo, FALSE, actbl, pdtbl);
    /* Initialize DC predictions to 0 */
    entropy->saved.last_dc_val[ci] = 0;
  }

  /* Precalculate decoding info for each block in an MCU of this scan */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];
    /* Precalculate which table to use for each block */
    entropy->dc_cur_tbls[blkn] = entropy->dc_derived_tbls[compptr->dc_tbl_no];
    entropy->ac_cur_tbls[blkn] = entropy->ac_derived_tbls[compptr->ac_tbl_no];
    /* Decide whether we really care about the coefficient values */
    if (compptr->component_needed) {
      entropy->dc_needed[blkn] = TRUE;
      /* we don't need the ACs if producing a 1/8th-size image */
      entropy->ac_needed[blkn] = (compptr->_DCT_scaled_size > 1);
    } else {
      entropy->dc_needed[blkn] = entropy->ac_needed[blkn] = FALSE;
    }
  }

  /* Initialize bitread state variables */
  entropy->bitstate.bits_left = 0;
  entropy->bitstate.get_buffer = 0; /* unnecessary, but keeps Purify quiet */
  entropy->pub.insufficient_data = FALSE;

  /* Initialize restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;
}